

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_sort.h
# Opt level: O0

void __thiscall
embree::ParallelRadixSort<embree::parallel_map<unsigned_int,_unsigned_int>::KeyValue,_unsigned_int>
::tbbRadixIteration1
          (ParallelRadixSort<embree::parallel_map<unsigned_int,_unsigned_int>::KeyValue,_unsigned_int>
           *this,uint shift,KeyValue *src,KeyValue *dst,size_t threadIndex,size_t threadCount)

{
  uint uVar1;
  undefined8 uVar2;
  long lVar3;
  ulong uVar4;
  long in_RCX;
  long in_RDX;
  undefined4 in_ESI;
  long *in_RDI;
  ulong in_R8;
  ulong in_R9;
  size_t index;
  KeyValue elt;
  size_t i_4;
  size_t j_1;
  size_t i_3;
  size_t i_2;
  uint offset [256];
  size_t j;
  size_t i_1;
  size_t i;
  uint total [256];
  uint mask;
  size_t endID;
  size_t startID;
  ulong local_c18;
  undefined1 local_c10 [16];
  undefined1 local_c00 [16];
  undefined1 local_bf0 [24];
  ulong local_bd8;
  ulong local_bd0;
  ulong local_bc8;
  uint local_bc0 [2];
  undefined8 auStack_bb8 [129];
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 local_790;
  undefined8 uStack_788;
  ulong local_778;
  ulong local_770;
  undefined8 local_760;
  undefined8 uStack_758;
  ulong local_748;
  int local_740 [2];
  undefined8 auStack_738 [134];
  undefined4 local_304;
  ulong local_300;
  ulong local_2f8;
  long local_2e0;
  long local_2d8;
  undefined4 local_2cc;
  uint *local_2c0;
  undefined1 *local_2b8;
  undefined8 *local_2b0;
  undefined8 *local_2a8;
  undefined8 *local_2a0;
  undefined8 *local_298;
  undefined8 *local_290;
  undefined8 *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  undefined8 *local_268;
  undefined8 *local_260;
  undefined8 *local_258;
  undefined8 *local_250;
  undefined1 *local_248;
  undefined8 *local_240;
  undefined1 *local_238;
  undefined8 *local_230;
  undefined8 *local_228;
  undefined8 *local_220;
  undefined8 *local_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 *local_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 *local_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 *local_1c0;
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  undefined8 *local_198;
  undefined8 *local_190;
  undefined1 *local_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 *local_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 *local_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined1 *local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined1 *local_b8;
  int local_b0;
  int iStack_ac;
  int iStack_a8;
  int iStack_a4;
  undefined8 *local_98;
  int local_90;
  int iStack_8c;
  int iStack_88;
  int iStack_84;
  undefined1 *local_78;
  undefined8 *local_70;
  undefined8 *local_68;
  undefined8 *local_60;
  undefined8 *local_58;
  
  local_c18 = (in_R8 * in_RDI[3]) / in_R9;
  local_2f8 = local_c18;
  local_300 = ((in_R8 + 1) * in_RDI[3]) / in_R9;
  local_304 = 0xff;
  for (local_748 = 0; local_748 < 0x100; local_748 = local_748 + 4) {
    local_290 = (undefined8 *)((long)auStack_738 + local_748 * 4 + -8);
    local_288 = &local_760;
    local_180 = 0;
    uStack_178 = 0;
    local_760 = 0;
    uStack_758 = 0;
    local_298 = &local_760;
    local_198 = &local_760;
    local_1f8 = local_290;
    local_210 = 0;
    uStack_208 = 0;
    *local_290 = 0;
    *(undefined8 *)((long)auStack_738 + local_748 * 4) = 0;
  }
  for (local_770 = 0; local_770 < in_R9; local_770 = local_770 + 1) {
    for (local_778 = 0; local_778 < 0x100; local_778 = local_778 + 4) {
      local_2a0 = (undefined8 *)((long)auStack_738 + local_778 * 4 + -8);
      local_220 = (undefined8 *)((long)auStack_738 + local_778 * 4 + -8);
      local_218 = &local_7a0;
      local_70 = local_220;
      local_130 = *local_220;
      uStack_128 = *(undefined8 *)((long)auStack_738 + local_778 * 4);
      local_118 = &local_7a0;
      local_7a0 = local_130;
      uStack_798 = uStack_128;
      local_230 = (undefined8 *)(*in_RDI + local_770 * 0x400 + local_778 * 4);
      local_228 = &local_7b0;
      local_68 = local_230;
      local_110 = *local_230;
      uStack_108 = local_230[1];
      local_f8 = &local_7b0;
      local_7b0 = local_110;
      uStack_7a8 = uStack_108;
      local_258 = &local_790;
      local_260 = &local_7a0;
      local_268 = &local_7b0;
      local_1b0 = &local_7a0;
      local_1b8 = &local_7b0;
      local_160 = local_130;
      uStack_158 = uStack_128;
      local_170 = local_110;
      uStack_168 = uStack_108;
      local_160._0_4_ = (int)local_130;
      local_160._4_4_ = (int)((ulong)local_130 >> 0x20);
      uStack_158._0_4_ = (int)uStack_128;
      uStack_158._4_4_ = (int)((ulong)uStack_128 >> 0x20);
      local_170._0_4_ = (int)local_110;
      local_170._4_4_ = (int)((ulong)local_110 >> 0x20);
      uStack_168._0_4_ = (int)uStack_108;
      uStack_168._4_4_ = (int)((ulong)uStack_108 >> 0x20);
      local_98 = &local_790;
      local_b0 = (int)local_160 + (int)local_170;
      iStack_ac = local_160._4_4_ + local_170._4_4_;
      iStack_a8 = (int)uStack_158 + (int)uStack_168;
      iStack_a4 = uStack_158._4_4_ + uStack_168._4_4_;
      local_790 = CONCAT44(local_160._4_4_ + local_170._4_4_,(int)local_160 + (int)local_170);
      uStack_788 = CONCAT44(uStack_158._4_4_ + uStack_168._4_4_,(int)uStack_158 + (int)uStack_168);
      local_2a8 = &local_790;
      local_190 = &local_790;
      local_1d8 = local_2a0;
      local_1f0 = local_790;
      uStack_1e8 = uStack_788;
      *local_2a0 = local_790;
      *(undefined8 *)((long)auStack_738 + local_778 * 4) = uStack_788;
    }
  }
  local_bc0[0] = 0;
  for (local_bc8 = 1; local_bc8 < 0x100; local_bc8 = local_bc8 + 1) {
    *(int *)((long)auStack_bb8 + local_bc8 * 4 + -8) =
         *(int *)((long)auStack_bb8 + (local_bc8 - 1) * 4 + -8) +
         *(int *)((long)auStack_738 + (local_bc8 - 1) * 4 + -8);
  }
  for (local_bd0 = 0; local_2e0 = in_RCX, local_2d8 = in_RDX, local_2cc = in_ESI, local_bd0 < in_R8;
      local_bd0 = local_bd0 + 1) {
    for (local_bd8 = 0; local_bd8 < 0x100; local_bd8 = local_bd8 + 4) {
      local_2b0 = (undefined8 *)((long)auStack_bb8 + local_bd8 * 4 + -8);
      local_240 = (undefined8 *)((long)auStack_bb8 + local_bd8 * 4 + -8);
      local_238 = local_c00;
      local_60 = local_240;
      local_f0 = *local_240;
      uStack_e8 = *(undefined8 *)((long)auStack_bb8 + local_bd8 * 4);
      local_d8 = local_c00;
      local_250 = (undefined8 *)(*in_RDI + local_bd0 * 0x400 + local_bd8 * 4);
      local_248 = local_c10;
      local_58 = local_250;
      local_d0 = *local_250;
      uStack_c8 = local_250[1];
      local_b8 = local_c10;
      local_270 = local_bf0;
      local_278 = local_c00;
      local_280 = local_c10;
      local_1a0 = local_c00;
      local_1a8 = local_c10;
      local_140 = local_f0;
      uStack_138 = uStack_e8;
      local_150 = local_d0;
      uStack_148 = uStack_c8;
      local_140._0_4_ = (int)local_f0;
      local_140._4_4_ = (int)((ulong)local_f0 >> 0x20);
      uStack_138._0_4_ = (int)uStack_e8;
      uStack_138._4_4_ = (int)((ulong)uStack_e8 >> 0x20);
      local_150._0_4_ = (int)local_d0;
      local_150._4_4_ = (int)((ulong)local_d0 >> 0x20);
      uStack_148._0_4_ = (int)uStack_c8;
      uStack_148._4_4_ = (int)((ulong)uStack_c8 >> 0x20);
      local_78 = local_bf0;
      local_90 = (int)local_140 + (int)local_150;
      iStack_8c = local_140._4_4_ + local_150._4_4_;
      iStack_88 = (int)uStack_138 + (int)uStack_148;
      iStack_84 = uStack_138._4_4_ + uStack_148._4_4_;
      local_1d0 = CONCAT44(local_140._4_4_ + local_150._4_4_,(int)local_140 + (int)local_150);
      uStack_1c8 = CONCAT44(uStack_138._4_4_ + uStack_148._4_4_,(int)uStack_138 + (int)uStack_148);
      local_2b8 = local_bf0;
      local_188 = local_bf0;
      local_1c0 = local_2b0;
      *local_2b0 = local_1d0;
      *(undefined8 *)((long)auStack_bb8 + local_bd8 * 4) = uStack_1c8;
    }
  }
  for (; lVar3 = local_2e0, local_c18 < local_300; local_c18 = local_c18 + 1) {
    uVar2 = *(undefined8 *)(local_2d8 + local_c18 * 8);
    local_2c0 = (uint *)(local_2d8 + local_c18 * 8);
    uVar4 = (ulong)(*local_2c0 >> ((byte)local_2cc & 0x3f)) & 0xff;
    uVar1 = *(uint *)((long)auStack_bb8 + uVar4 * 4 + -8);
    *(uint *)((long)auStack_bb8 + uVar4 * 4 + -8) = uVar1 + 1;
    *(undefined8 *)(lVar3 + (ulong)uVar1 * 8) = uVar2;
  }
  return;
}

Assistant:

void tbbRadixIteration1(const Key shift, 
                            const Ty* __restrict const src, 
                            Ty* __restrict const dst, 
                            const size_t threadIndex, const size_t threadCount)
    {
      const size_t startID = (threadIndex+0)*N/threadCount;
      const size_t endID   = (threadIndex+1)*N/threadCount;
      
      /* mask to extract some number of bits */
      const Key mask = BUCKETS-1;
      
      /* calculate total number of items for each bucket */
      __aligned(64) unsigned int total[BUCKETS];
      /*
      for (size_t i=0; i<BUCKETS; i++)
        total[i] = 0;
      */
      for (size_t i=0; i<BUCKETS; i+=VSIZEX)
        vintx::store(&total[i], zero);
      
      for (size_t i=0; i<threadCount; i++)
      {
        /*
        for (size_t j=0; j<BUCKETS; j++)
          total[j] += radixCount[i][j];
        */
        for (size_t j=0; j<BUCKETS; j+=VSIZEX)
          vintx::store(&total[j], vintx::load(&total[j]) + vintx::load(&radixCount[i][j]));
      }
      
      /* calculate start offset of each bucket */
      __aligned(64) unsigned int offset[BUCKETS];
      offset[0] = 0;
      for (size_t i=1; i<BUCKETS; i++)    
        offset[i] = offset[i-1] + total[i-1];
      
      /* calculate start offset of each bucket for this thread */
      for (size_t i=0; i<threadIndex; i++)
      {
        /*
        for (size_t j=0; j<BUCKETS; j++)
          offset[j] += radixCount[i][j];
        */
        for (size_t j=0; j<BUCKETS; j+=VSIZEX)
          vintx::store(&offset[j], vintx::load(&offset[j]) + vintx::load(&radixCount[i][j]));
      }
      
      /* copy items into their buckets */
#if defined(__INTEL_COMPILER)
#pragma nounroll
#endif
      for (size_t i=startID; i<endID; i++) {
        const Ty elt = src[i];
#if defined(__64BIT__)
        const size_t index = ((size_t)(Key)src[i] >> (size_t)shift) & (size_t)mask;
#else
        const size_t index = ((Key)src[i] >> shift) & mask;
#endif
        dst[offset[index]++] = elt;
      }
    }